

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O2

bool __thiscall CECorrections::LoadTtUt1(CECorrections *this)

{
  bool bVar1;
  size_type sVar2;
  istream *piVar3;
  reference pvVar4;
  int iVar5;
  allocator<double> local_4d9;
  _func_int **local_4d8;
  vector<double,_std::allocator<double>_> *local_4d0;
  vector<double,_std::allocator<double>_> *local_4c8;
  double delt;
  CECorrections *local_4b8;
  string url;
  string line;
  vector<double,_std::allocator<double>_> local_470;
  vector<double,_std::allocator<double>_> greg_vect;
  CECorrections local_440;
  ifstream corrections_file;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(&this->ttut1_mjd_);
  if (sVar2 == 0) {
    local_4d0 = &this->ttut1_mjd_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&url,"http://maia.usno.navy.mil/ser7/deltat.data",
               (allocator *)&corrections_file);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&corrections_file);
    LoadFile((CECorrections *)&corrections_file,(string *)this,&this->ttut1_file_hist_);
    std::vector<double,_std::allocator<double>_>::reserve(local_4d0,5000);
    std::__cxx11::string::string((string *)&line);
    local_4c8 = &this->ttut1_delt_;
    local_4b8 = this;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&corrections_file,(string *)&line);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      local_440._vptr_CECorrections = (_func_int **)0x0;
      std::allocator<double>::allocator(&local_4d9);
      std::vector<double,_std::allocator<double>_>::vector
                (&greg_vect,4,(value_type_conflict *)&local_440,&local_4d9);
      __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_4d9);
      std::__cxx11::string::substr((ulong)&local_440,(ulong)&line);
      local_4d8 = (_func_int **)std::__cxx11::stod((string *)&local_440,(size_t *)0x0);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&greg_vect,0);
      *pvVar4 = (value_type)local_4d8;
      std::__cxx11::string::~string((string *)&local_440);
      std::__cxx11::string::substr((ulong)&local_440,(ulong)&line);
      local_4d8 = (_func_int **)std::__cxx11::stod((string *)&local_440,(size_t *)0x0);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&greg_vect,1);
      *pvVar4 = (value_type)local_4d8;
      std::__cxx11::string::~string((string *)&local_440);
      std::__cxx11::string::substr((ulong)&local_440,(ulong)&line);
      local_4d8 = (_func_int **)std::__cxx11::stod((string *)&local_440,(size_t *)0x0);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&greg_vect,2);
      *pvVar4 = (value_type)local_4d8;
      std::__cxx11::string::~string((string *)&local_440);
      std::vector<double,_std::allocator<double>_>::vector(&local_470,&greg_vect);
      local_4d8 = (_func_int **)CEDate::GregorianVect2MJD(&local_470);
      std::vector<double,_std::allocator<double>_>::~vector(&local_470);
      std::__cxx11::string::substr((ulong)&local_440,(ulong)&line);
      delt = std::__cxx11::stod((string *)&local_440,(size_t *)0x0);
      iVar5 = (int)(double)local_4d8;
      std::__cxx11::string::~string((string *)&local_440);
      local_440._vptr_CECorrections = (_func_int **)(double)iVar5;
      std::vector<double,_std::allocator<double>_>::push_back
                (local_4d0,(value_type_conflict *)&local_440);
      std::vector<double,_std::allocator<double>_>::push_back(local_4c8,&delt);
      std::vector<double,_std::allocator<double>_>::~vector(&greg_vect);
    }
    std::ifstream::close();
    std::__cxx11::string::operator=((string *)&url,"http://maia.usno.navy.mil/ser7/deltat.preds");
    LoadFile(&local_440,(string *)local_4b8,&local_4b8->ttut1_file_pred_);
    std::ifstream::operator=(&corrections_file,(ifstream *)&local_440);
    std::ifstream::~ifstream(&local_440);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&corrections_file,(string *)&line);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&corrections_file,(string *)&line);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      std::__cxx11::string::substr((ulong)&local_440,(ulong)&line);
      iVar5 = std::__cxx11::stoi((string *)&local_440,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_440);
      local_4d8 = (_func_int **)(double)iVar5;
      pvVar4 = std::vector<double,_std::allocator<double>_>::back(local_4d0);
      if (*pvVar4 <= (double)local_4d8 && (double)local_4d8 != *pvVar4) {
        std::__cxx11::string::substr((ulong)&local_440,(ulong)&line);
        delt = std::__cxx11::stod((string *)&local_440,(size_t *)0x0);
        std::__cxx11::string::~string((string *)&local_440);
        local_440._vptr_CECorrections = local_4d8;
        std::vector<double,_std::allocator<double>_>::push_back
                  (local_4d0,(value_type_conflict *)&local_440);
        std::vector<double,_std::allocator<double>_>::push_back(local_4c8,&delt);
      }
    }
    std::vector<double,_std::allocator<double>_>::shrink_to_fit(local_4d0);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit(local_4c8);
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&corrections_file);
    std::__cxx11::string::~string((string *)&url);
  }
  return true;
}

Assistant:

bool CECorrections::LoadTtUt1(void) const
{
    bool loaded = true;
    if (ttut1_mjd_.size() == 0) {

        try{
            // Check if the file has been stored
            std::string   url = "http://maia.usno.navy.mil/ser7/deltat.data";
            std::ifstream corrections_file = LoadFile(ttut1_file_hist_, url);    
        
            // Allocate an approximate amount of memory for the values
            ttut1_mjd_.reserve(5000);

            // Preliminary storage values
            int    mjd;
            double delt;

            // Loop through each line of the file
            std::string line;
            while(std::getline(corrections_file, line)) {

                // Extract the Gregorian vector date
                std::vector<double> greg_vect(4, 0.0);
                greg_vect[0] = std::stod(line.substr(1,4));
                greg_vect[1] = std::stod(line.substr(6,2));
                greg_vect[2] = std::stod(line.substr(9,2));
                mjd = CEDate::GregorianVect2MJD(greg_vect);

                // Try to load delta T from the file
                try {
                    delt = std::stod(line.substr(13,7));
                } 
                // Otherwise load from bulletin A positions
                catch (std::exception& e) {
                    // Reached end of useable fields in the file
                    break;
                }

                // Store the values into a vector
                ttut1_mjd_.push_back( mjd );
                ttut1_delt_.push_back( delt );
            }

            // Close the corrections file
            corrections_file.close();

            // Load the predicted corrections for the future
            url = "http://maia.usno.navy.mil/ser7/deltat.preds";
            corrections_file = LoadFile(ttut1_file_pred_, url);

            // Loop through each line of the file
            std::getline(corrections_file, line);   // First line is a header
            while(std::getline(corrections_file, line)) {

                // Extract the MJD
                mjd = std::stoi(line.substr(3,9));

                // Only add this value if it is actually from a later date
                // than the last entry in the vector
                if (mjd > ttut1_mjd_.back()) {

                    // Try to load delta T from the file
                    try {
                        delt = std::stod(line.substr(24,5));
                    } 
                    // Otherwise load from bulletin A positions
                    catch (std::exception& e) {
                        // Reached end of useable fields in the file
                        break;
                    }

                    // Store the values into a vector
                    ttut1_mjd_.push_back( mjd );
                    ttut1_delt_.push_back( delt );
                }
            }

            // Shrink up the vectors so we dont take more memory than necessary
            ttut1_mjd_.shrink_to_fit();
            ttut1_delt_.shrink_to_fit();

        } catch (std::exception& e) {
            std::cerr << "ERROR Unable to load corrections from file" << std::endl;
            std::cerr << e.what() << std::endl;
            loaded = false;
        }
    }
    return loaded;
}